

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanRegExpConstant
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,ArenaAllocator *alloc)

{
  StandardChars<unsigned_char> *standardEncodedChars;
  StandardChars<char16_t> *standardChars;
  DebugWriter *w;
  RegexStatsDatabase *this_00;
  Node *root;
  RegexPattern *pattern;
  undefined1 local_118 [8];
  Parser<UTF8EncodingPolicyBase<false>,_true> parser;
  CharCount local_44;
  CharCount local_40;
  charcount_t bodyLen;
  charcount_t totalLen;
  charcount_t bodyChars;
  charcount_t totalChars;
  RegexFlags flags;
  
  w = (DebugWriter *)0x0;
  parser.deferredIfUnicodeError = (ParseError *)alloc;
  ThreadContext::ProbeStackNoDispose
            (this->m_scriptContext->threadContext,0x6000,this->m_scriptContext,(PVOID)0x0);
  Js::ScriptContext::ProfileBegin(this->m_scriptContext,RegexCompilePhase);
  standardEncodedChars =
       ThreadContext::GetStandardChars(this->m_scriptContext->threadContext,(uint8 *)0x0);
  standardChars =
       ThreadContext::GetStandardChars(this->m_scriptContext->threadContext,(char16 *)0x0);
  if (DAT_015bc47a == '\x01') {
    w = Js::ScriptContext::GetRegexDebugWriter(this->m_scriptContext);
  }
  if (DAT_015bc479 == '\x01') {
    this_00 = Js::ScriptContext::GetRegexStatsDatabase(this->m_scriptContext);
    UnifiedRegex::RegexStatsDatabase::BeginProfile(this_00);
  }
  local_40 = 0;
  bodyLen = 0;
  totalLen = 0;
  local_44 = 0;
  bodyChars._3_1_ = NoRegexFlags;
  UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::Parser
            ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_118,this->m_scriptContext,
             (ArenaAllocator *)parser.deferredIfUnicodeError,standardEncodedChars,standardChars,
             ((this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions &
             doAllowThreeByteSurrogates) == doDefault,w);
  root = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ParseLiteral
                   ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_118,
                    this->m_currentCharacter,this->m_pchLast,&local_44,&local_40,&bodyLen,&totalLen,
                    (RegexFlags *)((long)&bodyChars + 3));
  if (this->m_parser->m_isInBackground == false) {
    pattern = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CompileProgram<true>
                        ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_118,root,
                         &this->m_currentCharacter,local_40,bodyLen,local_44,totalLen,
                         bodyChars._3_1_);
  }
  else {
    pattern = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CompileProgram<false>
                        ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_118,root,
                         &this->m_currentCharacter,local_40,bodyLen,local_44,totalLen,
                         bodyChars._3_1_);
  }
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
       (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits + (long)local_118;
  Token::SetRegex((Token *)this->m_ptoken,pattern,this->m_parser);
  return tkRegExp;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanRegExpConstant(ArenaAllocator* alloc)
{
    PROBE_STACK_NO_DISPOSE(m_scriptContext, Js::Constants::MinStackRegex);

    // SEE ALSO: RegexHelper::PrimCompileDynamic()

#ifdef PROFILE_EXEC
    m_scriptContext->ProfileBegin(Js::RegexCompilePhase);
#endif
    ArenaAllocator* ctAllocator = alloc;
    UnifiedRegex::StandardChars<EncodedChar>* standardEncodedChars = m_scriptContext->GetThreadContext()->GetStandardChars((EncodedChar*)0);
    UnifiedRegex::StandardChars<char16>* standardChars = m_scriptContext->GetThreadContext()->GetStandardChars((char16*)0);
#if ENABLE_REGEX_CONFIG_OPTIONS
    UnifiedRegex::DebugWriter *w = 0;
    if (REGEX_CONFIG_FLAG(RegexDebug))
        w = m_scriptContext->GetRegexDebugWriter();
    if (REGEX_CONFIG_FLAG(RegexProfile))
        m_scriptContext->GetRegexStatsDatabase()->BeginProfile();
#endif
    UnifiedRegex::Node* root = 0;
    charcount_t totalLen = 0, bodyChars = 0, totalChars = 0, bodyLen = 0;
    UnifiedRegex::RegexFlags flags = UnifiedRegex::NoRegexFlags;
    UnifiedRegex::Parser<EncodingPolicy, true> parser
            ( m_scriptContext
            , ctAllocator
            , standardEncodedChars
            , standardChars
            , this->IsUtf8()
#if ENABLE_REGEX_CONFIG_OPTIONS
            , w
#endif
            );
    try
    {
        root = parser.ParseLiteral(m_currentCharacter, m_pchLast, bodyLen, totalLen, bodyChars, totalChars, flags);
    }
    catch (UnifiedRegex::ParseError e)
    {
#ifdef PROFILE_EXEC
        m_scriptContext->ProfileEnd(Js::RegexCompilePhase);
#endif
        m_currentCharacter += e.encodedPos;
        Error(e.error);
    }

    UnifiedRegex::RegexPattern* pattern;
    if (m_parser->IsBackgroundParser())
    {
        // Avoid allocating pattern from recycler on background thread. The main thread will create the pattern
        // and hook it to this parse node.
        pattern = parser.template CompileProgram<false>(root, m_currentCharacter, totalLen, bodyChars, bodyLen, totalChars, flags);
    }
    else
    {
        pattern = parser.template CompileProgram<true>(root, m_currentCharacter, totalLen, bodyChars, bodyLen, totalChars, flags);
    }
    this->RestoreMultiUnits(this->m_cMultiUnits + parser.GetMultiUnits()); // m_currentCharacter changed, sync MultiUnits

    return m_ptoken->SetRegex(pattern, m_parser);
}